

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O0

void TemplateCacheUnittest::TestReloadLazyWithDifferentSearchPaths(void)

{
  __type _Var1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  Template *pTVar5;
  allocator local_471;
  string local_470 [32];
  TemplateString local_450;
  allocator local_429;
  string local_428 [32];
  TemplateString local_408;
  Template *local_3e8;
  Template *foo_post_reload;
  string local_3d8 [32];
  string local_3b8 [39];
  allocator local_391;
  string local_390 [32];
  string local_370 [39];
  allocator local_349;
  string local_348 [39];
  allocator local_321;
  string local_320 [32];
  string local_300 [8];
  string path_a_foo;
  TemplateString local_2e0;
  allocator local_2b9;
  string local_2b8 [32];
  string local_298 [39];
  allocator local_271;
  string local_270 [32];
  string local_250 [39];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  string local_1e0 [8];
  string path_b_foo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [39];
  allocator local_179;
  string local_178 [32];
  string local_158 [8];
  string pathB;
  allocator local_131;
  string local_130 [32];
  string local_110 [8];
  string pathA;
  TemplateCachePeer local_f0;
  TemplateCachePeer cache_peer;
  undefined1 local_d8 [8];
  TemplateCache cache1;
  TemplateString local_98;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_98,"empty");
  ctemplate::TemplateDictionary::TemplateDictionary(local_78,&local_98,(UnsafeArena *)0x0);
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)local_d8);
  ctemplate::TemplateCachePeer::TemplateCachePeer(&local_f0,(TemplateCache *)local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"a/",&local_131);
  ctemplate::PathJoin(local_110,(string *)ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"b/",&local_179);
  ctemplate::PathJoin(local_158,(string *)ctemplate::FLAGS_test_tmpdir_abi_cxx11_);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  ctemplate::CreateOrCleanTestDir((string *)local_110);
  ctemplate::CreateOrCleanTestDir((string *)local_158);
  ctemplate::TemplateCache::SetTemplateRootDirectory((string *)local_d8);
  ctemplate::TemplateCache::AddAlternateTemplateRootDirectory((string *)local_d8);
  ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
  _Var1 = std::operator==(local_1a0,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_110);
  std::__cxx11::string::~string((string *)local_1a0);
  if (((_Var1 ^ 0xffU) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x231,"cache1.template_root_directory() == pathA");
    ctemplate::TemplateCache::template_root_directory_abi_cxx11_();
    _Var1 = std::operator==(local_1c0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_110);
    if (!_Var1) {
      __assert_fail("cache1.template_root_directory() == pathA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x231,
                    "static void TemplateCacheUnittest::TestReloadLazyWithDifferentSearchPaths()");
    }
    std::__cxx11::string::~string((string *)local_1c0);
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"template_foo",&local_201);
  ctemplate::PathJoin(local_1e0,local_158);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"b/template_foo",&local_229);
  ctemplate::StringToFile((string *)local_228,(string *)local_1e0);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"template_foo",&local_271);
  ctemplate::TemplateCache::FindTemplateFilename(local_250);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = strcmp(pcVar3,pcVar4);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  if (iVar2 != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x237,
           "strcmp(path_b_foo.c_str(), cache1.FindTemplateFilename(\"template_foo\").c_str()) == 0")
    ;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b8,"template_foo",&local_2b9);
    ctemplate::TemplateCache::FindTemplateFilename(local_298);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iVar2 = strcmp(pcVar3,pcVar4);
    if (iVar2 == 0) {
      std::__cxx11::string::~string(local_298);
      std::__cxx11::string::~string(local_2b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
      exit(1);
    }
    __assert_fail("strcmp(path_b_foo.c_str(), cache1.FindTemplateFilename(\"template_foo\").c_str()) == 0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x237,
                  "static void TemplateCacheUnittest::TestReloadLazyWithDifferentSearchPaths()");
  }
  ctemplate::TemplateString::TemplateString(&local_2e0,"template_foo");
  ctemplate::TemplateCache::GetTemplate((TemplateString *)local_d8,(Strip)&local_2e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"template_foo",&local_321);
  ctemplate::PathJoin(local_300,local_110);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"a/template_foo",&local_349);
  ctemplate::StringToFile((string *)local_348,(string *)local_300);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"template_foo",&local_391);
  ctemplate::TemplateCache::FindTemplateFilename(local_370);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = strcmp(pcVar3,pcVar4);
  std::__cxx11::string::~string(local_370);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  if (iVar2 == 0) {
    ctemplate::TemplateCache::ReloadAllIfChanged((ReloadType)local_d8);
    ctemplate::TemplateString::TemplateString(&local_408,"template_foo");
    pTVar5 = ctemplate::TemplateCachePeer::GetTemplate(&local_f0,&local_408,STRIP_WHITESPACE);
    local_3e8 = pTVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_428,"a/template_foo",&local_429);
    ctemplate::AssertExpandIs(pTVar5,local_78,(string *)local_428,true);
    std::__cxx11::string::~string(local_428);
    std::allocator<char>::~allocator((allocator<char> *)&local_429);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    unlink(pcVar3);
    ctemplate::TemplateCache::ReloadAllIfChanged((ReloadType)local_d8);
    ctemplate::TemplateString::TemplateString(&local_450,"template_foo");
    pTVar5 = ctemplate::TemplateCachePeer::GetTemplate(&local_f0,&local_450,STRIP_WHITESPACE);
    local_3e8 = pTVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_470,"b/template_foo",&local_471);
    ctemplate::AssertExpandIs(pTVar5,local_78,(string *)local_470,true);
    std::__cxx11::string::~string(local_470);
    std::allocator<char>::~allocator((allocator<char> *)&local_471);
    std::__cxx11::string::~string(local_300);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string(local_110);
    ctemplate::TemplateCache::~TemplateCache((TemplateCache *)local_d8);
    ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0x23f,
         "strcmp(path_a_foo.c_str(), cache1.FindTemplateFilename(\"template_foo\").c_str()) == 0");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"template_foo",(allocator *)((long)&foo_post_reload + 7));
  ctemplate::TemplateCache::FindTemplateFilename(local_3b8);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  iVar2 = strcmp(pcVar3,pcVar4);
  if (iVar2 == 0) {
    std::__cxx11::string::~string(local_3b8);
    std::__cxx11::string::~string(local_3d8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&foo_post_reload + 7));
    exit(1);
  }
  __assert_fail("strcmp(path_a_foo.c_str(), cache1.FindTemplateFilename(\"template_foo\").c_str()) == 0"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                ,0x23f,"static void TemplateCacheUnittest::TestReloadLazyWithDifferentSearchPaths()"
               );
}

Assistant:

static void TestReloadLazyWithDifferentSearchPaths() {
    // Identical test as above with but with LAZY_RELOAD
    TemplateDictionary dict("empty");
    TemplateCache cache1;
    TemplateCachePeer cache_peer(&cache1);

    const string pathA = PathJoin(FLAGS_test_tmpdir, "a/");
    const string pathB = PathJoin(FLAGS_test_tmpdir, "b/");
    CreateOrCleanTestDir(pathA);
    CreateOrCleanTestDir(pathB);

    cache1.SetTemplateRootDirectory(pathA);
    cache1.AddAlternateTemplateRootDirectory(pathB);
    ASSERT(cache1.template_root_directory() == pathA);

    // Add b/foo
    const string path_b_foo = PathJoin(pathB, "template_foo");
    StringToFile("b/template_foo", path_b_foo);
    ASSERT_STREQ(path_b_foo.c_str(),
                 cache1.FindTemplateFilename("template_foo").c_str());
    // Add b/foo to the template cache.
    cache1.GetTemplate("template_foo", DO_NOT_STRIP);

    // Add a/foo
    const string path_a_foo = PathJoin(pathA, "template_foo");
    StringToFile("a/template_foo", path_a_foo);
    ASSERT_STREQ(path_a_foo.c_str(),
                 cache1.FindTemplateFilename("template_foo").c_str());

    // Now, on reload we pick up foo from the earlier search path: a/foo
    cache1.ReloadAllIfChanged(TemplateCache::LAZY_RELOAD);
    const Template* foo_post_reload = cache_peer.GetTemplate("template_foo",
                                                             STRIP_WHITESPACE);
    AssertExpandIs(foo_post_reload, &dict, "a/template_foo",
                   true);

    // Delete a/foo and reload. Now we pick up the next available foo: b/foo
    unlink(path_a_foo.c_str());
    cache1.ReloadAllIfChanged(TemplateCache::LAZY_RELOAD);
    foo_post_reload = cache_peer.GetTemplate("template_foo",
                                             STRIP_WHITESPACE);
    AssertExpandIs(foo_post_reload, &dict, "b/template_foo",
                   true);
  }